

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalFederateId.hpp
# Opt level: O0

GlobalFederateId helics::getSpecialFederateId(GlobalBrokerId broker,BaseType index)

{
  bool bVar1;
  BaseType BVar2;
  int in_ESI;
  GlobalBrokerId local_8;
  GlobalFederateId local_4;
  
  bVar1 = GlobalBrokerId::operator!=(&local_8,(GlobalBrokerId)0x1);
  if (bVar1) {
    BVar2 = GlobalBrokerId::baseValue(&local_8);
    GlobalFederateId::GlobalFederateId(&local_4,(BVar2 + -0x6ffffffe) * -3 + 0x70000000 + in_ESI);
  }
  else {
    GlobalFederateId::GlobalFederateId(&local_4,0x6fffffff - in_ESI);
  }
  return (GlobalFederateId)local_4.gid;
}

Assistant:

constexpr GlobalFederateId getSpecialFederateId(GlobalBrokerId broker,
                                                GlobalBrokerId::BaseType index)
{
    // allow 3 special federates per subbroker/core + 3 special ones for the root broker
    return (broker != gRootBrokerID) ?
        (GlobalFederateId(gGlobalBrokerIdShift -
                          3 * (broker.baseValue() - gGlobalBrokerIdShift + 2) + index)) :
        GlobalFederateId(gGlobalBrokerIdShift - index - 1);
}